

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O0

ngx_int_t ngx_http_variable_https(ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  *(undefined8 *)v = ngx_http_variable_null_value._0_8_;
  v->data = ngx_http_variable_null_value.data;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_https(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
#if (NGX_HTTP_SSL)

    if (r->connection->ssl) {
        v->len = sizeof("on") - 1;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = (u_char *) "on";

        return NGX_OK;
    }

#endif

    *v = ngx_http_variable_null_value;

    return NGX_OK;
}